

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD2Loader.cpp
# Opt level: O0

void __thiscall Assimp::MD2Importer::ValidateHeader(MD2Importer *this)

{
  DeadlyImportError *pDVar1;
  Logger *pLVar2;
  allocator<char> local_1d1;
  string local_1d0;
  undefined1 local_1aa;
  allocator<char> local_1a9;
  string local_1a8;
  int local_188;
  undefined1 local_182;
  allocator<char> local_181;
  uint frameSize;
  undefined1 local_15a;
  allocator<char> local_159;
  string local_158;
  undefined1 local_132;
  allocator<char> local_131;
  string local_130;
  undefined1 local_10a;
  allocator<char> local_109;
  string local_108;
  undefined1 local_e2;
  allocator<char> local_e1;
  string local_e0;
  undefined1 local_ba;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_92;
  allocator<char> local_91;
  string local_90;
  undefined1 local_6d;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char local_15;
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  MD2Importer *pMStack_10;
  char szBuffer [5];
  MD2Importer *this_local;
  
  pMStack_10 = this;
  if ((this->m_pcHeader->magic != 0x49445032) && (this->m_pcHeader->magic != 0x32504449)) {
    local_15 = (char)this->m_pcHeader->magic;
    local_14 = *(undefined1 *)((long)&this->m_pcHeader->magic + 1);
    local_13 = *(undefined1 *)((long)&this->m_pcHeader->magic + 2);
    local_12 = *(undefined1 *)((long)&this->m_pcHeader->magic + 3);
    local_11 = 0;
    local_6d = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,&local_15,&local_59);
    std::operator+(&local_38,"Invalid MD2 magic word: should be IDP2, the magic word found is ",
                   &local_58);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_38);
    local_6d = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (this->m_pcHeader->version != 8) {
    pLVar2 = DefaultLogger::get();
    Logger::warn(pLVar2,"Unsupported md2 file version. Continuing happily ...");
  }
  if (this->m_pcHeader->numFrames == 0) {
    local_92 = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Invalid md2 file: NUM_FRAMES is 0",&local_91);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_90);
    local_92 = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (this->fileSize < this->m_pcHeader->offsetEnd) {
    local_ba = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Invalid md2 file: File is too small",&local_b9);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_b8);
    local_ba = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (0x400000 < this->m_pcHeader->numSkins) {
    local_e2 = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Invalid MD2 header: too many skins, would overflow",&local_e1);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_e0);
    local_e2 = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (0x4000000 < this->m_pcHeader->numVertices) {
    local_10a = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"Invalid MD2 header: too many vertices, would overflow",
               &local_109);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_108);
    local_10a = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (0x4000000 < this->m_pcHeader->numTexCoords) {
    local_132 = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"Invalid MD2 header: too many texcoords, would overflow",
               &local_131);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_130);
    local_132 = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (0x1555555 < this->m_pcHeader->numTriangles) {
    local_15a = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"Invalid MD2 header: too many triangles, would overflow",
               &local_159);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_158);
    local_15a = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (0x5d1745 < this->m_pcHeader->numFrames) {
    local_182 = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&frameSize,"Invalid MD2 header: too many frames, would overflow",&local_181
              );
    DeadlyImportError::DeadlyImportError(pDVar1,(string *)&frameSize);
    local_182 = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  local_188 = (this->m_pcHeader->numVertices - 1) * 4 + 0x2c;
  if ((ulong)this->m_pcHeader->offsetSkins + (ulong)this->m_pcHeader->numSkins * 0x40 <
      (ulong)this->fileSize) {
    if ((ulong)this->m_pcHeader->offsetTexCoords + (ulong)this->m_pcHeader->numTexCoords * 4 <
        (ulong)this->fileSize) {
      if ((ulong)this->m_pcHeader->offsetTriangles + (ulong)this->m_pcHeader->numTriangles * 0xc <
          (ulong)this->fileSize) {
        if ((this->m_pcHeader->offsetFrames + this->m_pcHeader->numFrames * local_188 <
             this->fileSize) && (this->m_pcHeader->offsetEnd <= this->fileSize)) {
          if (0x20 < this->m_pcHeader->numSkins) {
            pLVar2 = DefaultLogger::get();
            Logger::warn(pLVar2,"The model contains more skins than Quake 2 supports");
          }
          if (0x200 < this->m_pcHeader->numFrames) {
            pLVar2 = DefaultLogger::get();
            Logger::warn(pLVar2,"The model contains more frames than Quake 2 supports");
          }
          if (0x800 < this->m_pcHeader->numVertices) {
            pLVar2 = DefaultLogger::get();
            Logger::warn(pLVar2,"The model contains more vertices than Quake 2 supports");
          }
          if (this->m_pcHeader->numFrames <= this->configFrameID) {
            pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d0,"The requested frame is not existing the file",
                       &local_1d1);
            DeadlyImportError::DeadlyImportError(pDVar1,&local_1d0);
            __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          return;
        }
      }
    }
  }
  local_1aa = 1;
  pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"Invalid MD2 header: some offsets are outside the file",&local_1a9
            );
  DeadlyImportError::DeadlyImportError(pDVar1,&local_1a8);
  local_1aa = 0;
  __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void MD2Importer::ValidateHeader( )
{
    // check magic number
    if (m_pcHeader->magic != AI_MD2_MAGIC_NUMBER_BE &&
        m_pcHeader->magic != AI_MD2_MAGIC_NUMBER_LE)
    {
        char szBuffer[5];
        szBuffer[0] = ((char*)&m_pcHeader->magic)[0];
        szBuffer[1] = ((char*)&m_pcHeader->magic)[1];
        szBuffer[2] = ((char*)&m_pcHeader->magic)[2];
        szBuffer[3] = ((char*)&m_pcHeader->magic)[3];
        szBuffer[4] = '\0';

        throw DeadlyImportError("Invalid MD2 magic word: should be IDP2, the "
            "magic word found is " + std::string(szBuffer));
    }

    // check file format version
    if (m_pcHeader->version != 8)
        ASSIMP_LOG_WARN( "Unsupported md2 file version. Continuing happily ...");

    // check some values whether they are valid
    if (0 == m_pcHeader->numFrames)
        throw DeadlyImportError( "Invalid md2 file: NUM_FRAMES is 0");

    if (m_pcHeader->offsetEnd > (uint32_t)fileSize)
        throw DeadlyImportError( "Invalid md2 file: File is too small");

    if (m_pcHeader->numSkins > AI_MAX_ALLOC(MD2::Skin)) {
        throw DeadlyImportError("Invalid MD2 header: too many skins, would overflow");
    }

    if (m_pcHeader->numVertices > AI_MAX_ALLOC(MD2::Vertex)) {
        throw DeadlyImportError("Invalid MD2 header: too many vertices, would overflow");
    }

    if (m_pcHeader->numTexCoords > AI_MAX_ALLOC(MD2::TexCoord)) {
        throw DeadlyImportError("Invalid MD2 header: too many texcoords, would overflow");
    }

    if (m_pcHeader->numTriangles > AI_MAX_ALLOC(MD2::Triangle)) {
        throw DeadlyImportError("Invalid MD2 header: too many triangles, would overflow");
    }

    if (m_pcHeader->numFrames > AI_MAX_ALLOC(MD2::Frame)) {
        throw DeadlyImportError("Invalid MD2 header: too many frames, would overflow");
    }

    // -1 because Frame already contains one
    unsigned int frameSize = sizeof (MD2::Frame) + (m_pcHeader->numVertices - 1) * sizeof(MD2::Vertex);

    if (m_pcHeader->offsetSkins     + m_pcHeader->numSkins * sizeof (MD2::Skin)         >= fileSize ||
        m_pcHeader->offsetTexCoords + m_pcHeader->numTexCoords * sizeof (MD2::TexCoord) >= fileSize ||
        m_pcHeader->offsetTriangles + m_pcHeader->numTriangles * sizeof (MD2::Triangle) >= fileSize ||
        m_pcHeader->offsetFrames    + m_pcHeader->numFrames * frameSize                 >= fileSize ||
        m_pcHeader->offsetEnd           > fileSize)
    {
        throw DeadlyImportError("Invalid MD2 header: some offsets are outside the file");
    }

    if (m_pcHeader->numSkins > AI_MD2_MAX_SKINS)
        ASSIMP_LOG_WARN("The model contains more skins than Quake 2 supports");
    if ( m_pcHeader->numFrames > AI_MD2_MAX_FRAMES)
        ASSIMP_LOG_WARN("The model contains more frames than Quake 2 supports");
    if (m_pcHeader->numVertices > AI_MD2_MAX_VERTS)
        ASSIMP_LOG_WARN("The model contains more vertices than Quake 2 supports");

    if (m_pcHeader->numFrames <= configFrameID )
        throw DeadlyImportError("The requested frame is not existing the file");
}